

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingMesh::~IfcReinforcingMesh(IfcReinforcingMesh *this)

{
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x78 = 0x8b5938;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x60 = 0x8b5a78;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x8b5960;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x110 = 0x8b5988;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x148 = 0x8b59b0;
  *(undefined8 *)&this[-1].super_IfcReinforcingElement.field_0x178 = 0x8b59d8;
  this[-1].MeshWidth.ptr = 4.5120762495336e-317;
  this[-1].LongitudinalBarNominalDiameter = 4.51209601215943e-317;
  this[-1].LongitudinalBarCrossSectionArea = 4.51211577478527e-317;
  if ((undefined1 *)this[-1].LongitudinalBarSpacing != &this[-1].field_0x1f0) {
    operator_delete((undefined1 *)this[-1].LongitudinalBarSpacing);
  }
  IfcElement::~IfcElement
            ((IfcElement *)
             &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
              super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0x78,
             &PTR_construction_vtable_24__008b5700);
  return;
}

Assistant:

IfcReinforcingMesh() : Object("IfcReinforcingMesh") {}